

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O0

int getopt_read_value(getopt_context_t *ctx,getopt_option_t *found_opt)

{
  long lVar1;
  float fVar2;
  char *local_28;
  char *end;
  getopt_option_t *found_opt_local;
  getopt_context_t *ctx_local;
  
  local_28 = (char *)0x0;
  end = (char *)found_opt;
  found_opt_local = (getopt_option_t *)ctx;
  if (found_opt->type - GETOPT_OPTION_TYPE_REQUIRED_INT32 < 2) {
    lVar1 = strtol(ctx->current_opt_arg,&local_28,0);
    *(int *)&found_opt_local->value_desc = (int)lVar1;
  }
  else if (found_opt->type - GETOPT_OPTION_TYPE_REQUIRED_FP32 < 2) {
    fVar2 = strtof(ctx->current_opt_arg,&local_28);
    *(float *)&found_opt_local->value_desc = fVar2;
  }
  if (*local_28 == '\0') {
    ctx_local._4_4_ = *(int *)(end + 0x18);
  }
  else {
    found_opt_local->desc = *(char **)end;
    ctx_local._4_4_ = 0x21;
  }
  return ctx_local._4_4_;
}

Assistant:

static int getopt_read_value(getopt_context_t* ctx, const getopt_option_t* found_opt)
{
	char* end = 0x0;
	switch(found_opt->type)
	{
		case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
		case GETOPT_OPTION_TYPE_REQUIRED_INT32:
			ctx->current_value.i32 = (int)strtol(ctx->current_opt_arg, &end, 0);
			break;
		case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
		case GETOPT_OPTION_TYPE_REQUIRED_FP32:
			ctx->current_value.fp32 = strtof(ctx->current_opt_arg, &end);
			break;
		default:
			break;
	}

	if(*end != '\0')
	{
		ctx->current_opt_arg = found_opt->name;
		return '!';
	}
	return found_opt->value;
}